

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcStyledRepresentation::~IfcStyledRepresentation
          (IfcStyledRepresentation *this,void **vtt)

{
  void **vtt_local;
  IfcStyledRepresentation *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledRepresentation,_0UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledRepresentation,_0UL> *)
             &(this->super_IfcStyleModel).super_IfcRepresentation.field_0x90,vtt + 10);
  IfcStyleModel::~IfcStyleModel(&this->super_IfcStyleModel,vtt + 1);
  return;
}

Assistant:

IfcStyledRepresentation() : Object("IfcStyledRepresentation") {}